

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suite.c
# Opt level: O0

void add_tests_(TestSuite *suite,char *names,...)

{
  int iVar1;
  CgreenVector *vector;
  undefined8 in_RCX;
  undefined8 in_RDX;
  char *in_R8;
  va_list tests;
  int i;
  CgreenVector *test_names;
  CgreenVector *in_stack_fffffffffffffee8;
  TestSuite *in_stack_fffffffffffffef0;
  undefined8 local_d8;
  undefined8 local_d0;
  uint local_38;
  TestSuite *local_30;
  int local_1c;
  
  local_d8 = in_RDX;
  local_d0 = in_RCX;
  vector = create_vector_of_names(in_R8);
  local_30 = (TestSuite *)&stack0x00000008;
  local_38 = 0x10;
  for (local_1c = 0; iVar1 = cgreen_vector_size(vector), local_1c < iVar1; local_1c = local_1c + 1)
  {
    cgreen_vector_get(in_stack_fffffffffffffee8,0);
    if (local_38 < 0x29) {
      in_stack_fffffffffffffef0 = (TestSuite *)(&stack0xffffffffffffff18 + (int)local_38);
      local_38 = local_38 + 8;
    }
    else {
      in_stack_fffffffffffffef0 = local_30;
      local_30 = (TestSuite *)&local_30->filename;
    }
    add_test_(in_stack_fffffffffffffef0,(char *)in_stack_fffffffffffffee8,(CgreenTest *)0x1105b8);
  }
  destroy_cgreen_vector((CgreenVector *)in_stack_fffffffffffffef0);
  return;
}

Assistant:

void add_tests_(TestSuite *suite, const char *names, ...) {
    CgreenVector *test_names = create_vector_of_names(names);
    int i;
    va_list tests;
    va_start(tests, names);
    for (i = 0; i < cgreen_vector_size(test_names); i++) {
        add_test_(suite, (char *)(cgreen_vector_get(test_names, i)), va_arg(tests, CgreenTest *));
    }
    va_end(tests);
    destroy_cgreen_vector(test_names);
}